

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::passwordFile(Config *this,string *parameter)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int iVar4;
  Pipeline *pPVar5;
  undefined1 in_CL;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  bool local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node.super__List_node_base._M_prev =
       local_38._M_impl._M_node.super__List_node_base._M_next;
  iVar4 = std::__cxx11::string::compare((char *)parameter);
  if (iVar4 == 0) {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,(QUtil *)&std::cin,(istream *)0x0,(bool)in_CL);
  }
  else {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,(QUtil *)(parameter->_M_dataplus)._M_p,(char *)0x0,(bool)in_CL);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_38,&local_58);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_58);
  if (local_38._M_impl._M_node._M_size != 0) {
    QUtil::make_shared_cstr
              ((QUtil *)&local_58,
               (string *)(local_38._M_impl._M_node.super__List_node_base._M_next + 1));
    p_Var3 = local_58._M_impl._M_node.super__List_node_base._M_prev;
    p_Var2 = local_58._M_impl._M_node.super__List_node_base._M_next;
    peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_58._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    this_00 = (peVar1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (peVar1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)p_Var2;
    (peVar1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_58._M_impl._M_node.super__List_node_base._M_prev !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_58._M_impl._M_node.super__List_node_base._M_prev);
      }
    }
    if (1 < local_38._M_impl._M_node._M_size) {
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)&local_58,local_20);
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)local_58._M_impl._M_node.super__List_node_base._M_next,
                          &((this->o->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      pPVar5 = Pipeline::operator<<(pPVar5,": WARNING: all but the first line of");
      Pipeline::operator<<(pPVar5," the password file are ignored\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_58._M_impl._M_node.super__List_node_base._M_prev !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_58._M_impl._M_node.super__List_node_base._M_prev);
      }
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_38);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::passwordFile(std::string const& parameter)
{
    std::list<std::string> lines;
    if (parameter == "-") {
        QTC::TC("qpdf", "QPDFJob_config password stdin");
        lines = QUtil::read_lines_from_file(std::cin);
    } else {
        QTC::TC("qpdf", "QPDFJob_config password file");
        lines = QUtil::read_lines_from_file(parameter.c_str());
    }
    if (lines.size() >= 1) {
        o.m->password = QUtil::make_shared_cstr(lines.front());

        if (lines.size() > 1) {
            *QPDFLogger::defaultLogger()->getError()
                << this->o.m->message_prefix << ": WARNING: all but the first line of"
                << " the password file are ignored\n";
        }
    }
    return this;
}